

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.h
# Opt level: O0

void __thiscall
jsonnet::internal::TraceFrame::TraceFrame(TraceFrame *this,LocationRange *location,string *name)

{
  string *in_RDX;
  LocationRange *in_RDI;
  LocationRange *in_stack_ffffffffffffffc8;
  
  LocationRange::LocationRange(in_RDI,in_stack_ffffffffffffffc8);
  std::__cxx11::string::string((string *)(in_RDI + 1),in_RDX);
  return;
}

Assistant:

TraceFrame(const LocationRange &location, const std::string &name = "")
        : location(location), name(name)
    {
    }